

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O1

void __thiscall TPZFileStream::WriteData<unsigned_char>(TPZFileStream *this,uchar *p,int howMany)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ulong uVar2;
  undefined8 uStack_38;
  
  if (0 < howMany) {
    uVar2 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT17(p[uVar2],(undefined7)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->fOut,(char *)((long)&uStack_38 + 7),1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
    } while ((uint)howMany != uVar2);
  }
  return;
}

Assistant:

void  TPZFileStream::WriteData(const T *p, int howMany){
        for(int c=0; c<howMany; c++) fOut << p[c] << std::endl;
#ifdef PZDEBUG
        if (fOut.bad()) {
            PZError << "TFileStream:Could not write to stream" << std::endl;
            DebugStop();
        }
#endif
    }